

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall
Adjacency_Subgraph_update_levels_remove_Test::TestBody
          (Adjacency_Subgraph_update_levels_remove_Test *this)

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  element_type *peVar6;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var7;
  size_t __n;
  reference pvVar8;
  char *regex;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  AssertHelper local_710;
  Message local_708 [6];
  exception *e;
  allocator<unsigned_long> local_6c1;
  unsigned_long local_6c0;
  iterator local_6b8;
  size_type local_6b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_6a8;
  Adjacency_Subgraph local_690;
  undefined1 auStack_628 [8];
  TrueWithString gtest_msg;
  Message local_600;
  int local_5f4;
  exception *gtest_exception;
  Adjacency_Graph<false> local_5b8;
  ReturnSentinel local_580;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_558;
  DeathTest *gtest_dt;
  Message local_548;
  int local_53c;
  size_t local_538;
  size_t local_530;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_15;
  Message local_510;
  int local_504;
  size_t local_500;
  size_t local_4f8;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_14;
  Message local_4d8;
  int local_4cc;
  size_t local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_13;
  Message local_4a8;
  int local_49c;
  size_t local_498;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_460;
  Message local_458;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_428;
  Message local_420;
  unsigned_long local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_11;
  Message local_3f8;
  unsigned_long local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_10;
  Message local_3d0;
  unsigned_long local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_9;
  Message local_3a8;
  unsigned_long local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_8;
  Message local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_7;
  size_t i_vertex;
  Message local_358;
  int local_34c;
  size_t local_348;
  size_t local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_6;
  Message local_320;
  int local_314;
  size_t local_310;
  size_t local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_5;
  Message local_2e8;
  int local_2dc;
  size_t local_2d8;
  size_t local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_4;
  Message local_2b0;
  int local_2a4;
  size_t local_2a0;
  size_t local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_3;
  Message local_278;
  int local_26c;
  size_t local_268;
  size_t local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_2;
  Message local_240;
  int local_234;
  size_t local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_1;
  Message local_210;
  int local_204;
  size_t local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1c8;
  Message local_1c0;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  undefined1 local_100 [8];
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> i_global_local;
  allocator<unsigned_long> local_d9;
  unsigned_long local_d8;
  iterator local_d0;
  size_type local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  undefined1 local_a8 [8];
  Adjacency_Subgraph subgraph;
  Adjacency_Graph<false> graph;
  Adjacency_Subgraph_update_levels_remove_Test *this_local;
  
  Disa::create_graph_structured<false>
            ((Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,3);
  local_d8 = 4;
  local_d0 = &local_d8;
  local_c8 = 1;
  std::allocator<unsigned_long>::allocator(&local_d9);
  __l_00._M_len = local_c8;
  __l_00._M_array = local_d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,__l_00,&local_d9);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_a8,
             (Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_c0,2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_c0);
  std::allocator<unsigned_long>::~allocator(&local_d9);
  std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>>();
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar_.message_,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_100);
  Disa::Adjacency_Subgraph::update_levels
            ((Adjacency_Subgraph *)local_a8,
             (Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar_.message_);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar_.message_);
  local_121 = std::operator==((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)local_100,(nullptr_t)0x0);
  local_121 = !local_121;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_120,
               (AssertionResult *)"i_global_local == nullptr","true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x205,pcVar5);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  peVar6 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_100);
  local_169 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(peVar6);
  local_169 = !local_169;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_168,
               (AssertionResult *)"i_global_local->empty()","true","false",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x206,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1b1 = Disa::Adjacency_Subgraph::is_parent
                        ((Adjacency_Subgraph *)local_a8,
                         (Adjacency_Graph<false> *)
                         &subgraph.level_set_value.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar2) {
    testing::Message::Message(&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_1b0,
               (AssertionResult *)"subgraph.is_parent(graph)","false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x207,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_200 = Disa::Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)local_a8);
  local_204 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1f8,"subgraph.size_vertex()","5",&local_200,&local_204);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar2) {
    testing::Message::Message(&local_210);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_230 = Disa::Adjacency_Subgraph::size_edge((Adjacency_Subgraph *)local_a8);
  local_234 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_228,"subgraph.size_edge()","4",&local_230,&local_234);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(&local_240);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_268 = 0;
  local_260 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_268);
  local_26c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_258,"subgraph.vertex_level(0)","0",&local_260,&local_26c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(&local_278);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_2a0 = 1;
  local_298 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_2a0);
  local_2a4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_290,"subgraph.vertex_level(1)","1",&local_298,&local_2a4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(&local_2b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2d8 = 2;
  local_2d0 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_2d8);
  local_2dc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2c8,"subgraph.vertex_level(2)","1",&local_2d0,&local_2dc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar2) {
    testing::Message::Message(&local_2e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_310 = 3;
  local_308 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_310);
  local_314 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_300,"subgraph.vertex_level(3)","1",&local_308,&local_314);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar2) {
    testing::Message::Message(&local_320);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_348 = 4;
  local_340 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_348);
  local_34c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_338,"subgraph.vertex_level(4)","1",&local_340,&local_34c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar2) {
    testing::Message::Message(&local_358);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i_vertex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x210,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i_vertex,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_vertex);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  for (gtest_ar_7.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      uVar1._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           gtest_ar_7.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl,
      _Var7.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )Disa::Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)local_a8),
      (ulong)uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl <
      (ulong)_Var7.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      gtest_ar_7.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    peVar6 = std::
             __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_100);
    __n = Disa::Adjacency_Subgraph::local_global
                    ((Adjacency_Subgraph *)local_a8,(size_t *)&gtest_ar_7.message_);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar6,__n);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_378,"(*i_global_local)[subgraph.local_global(i_vertex)]","i_vertex"
               ,pvVar8,(unsigned_long *)&gtest_ar_7.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
    if (!bVar2) {
      testing::Message::Message(&local_380);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                 ,0x212,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_380);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_380);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  }
  peVar6 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_100);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar6,0);
  local_3a0 = std::numeric_limits<unsigned_long>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_398,"(*i_global_local)[0]","std::numeric_limits<std::size_t>::max()",
             pvVar8,&local_3a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar2) {
    testing::Message::Message(&local_3a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x213,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  peVar6 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_100);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar6,2);
  local_3c8 = std::numeric_limits<unsigned_long>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_3c0,"(*i_global_local)[2]","std::numeric_limits<std::size_t>::max()",
             pvVar8,&local_3c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar2) {
    testing::Message::Message(&local_3d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x214,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  peVar6 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_100);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar6,6);
  local_3f0 = std::numeric_limits<unsigned_long>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_3e8,"(*i_global_local)[6]","std::numeric_limits<std::size_t>::max()",
             pvVar8,&local_3f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar2) {
    testing::Message::Message(&local_3f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x215,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  peVar6 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_100);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar6,8);
  local_418 = std::numeric_limits<unsigned_long>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_410,"(*i_global_local)[8]","std::numeric_limits<std::size_t>::max()",
             pvVar8,&local_418);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar2) {
    testing::Message::Message(&local_420);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              (&local_428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x216,pcVar5);
    testing::internal::AssertHelper::operator=(&local_428,&local_420);
    testing::internal::AssertHelper::~AssertHelper(&local_428);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar__3.message_,(nullptr_t)0x0);
  Disa::Adjacency_Subgraph::update_levels
            ((Adjacency_Subgraph *)local_a8,
             (Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar__3.message_);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar__3.message_);
  local_449 = Disa::Adjacency_Subgraph::is_parent
                        ((Adjacency_Subgraph *)local_a8,
                         (Adjacency_Graph<false> *)
                         &subgraph.level_set_value.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar2) {
    testing::Message::Message(&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_448,
               (AssertionResult *)"subgraph.is_parent(graph)","false","true",in_R9);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x219,pcVar5);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_498 = Disa::Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)local_a8);
  local_49c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_490,"subgraph.size_vertex()","1",&local_498,&local_49c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar2) {
    testing::Message::Message(&local_4a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  local_4c8 = Disa::Adjacency_Subgraph::size_edge((Adjacency_Subgraph *)local_a8);
  local_4cc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4c0,"subgraph.size_edge()","0",&local_4c8,&local_4cc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar2) {
    testing::Message::Message(&local_4d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_500 = 0;
  local_4f8 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_500);
  local_504 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4f0,"subgraph.vertex_level(0)","0",&local_4f8,&local_504);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar2) {
    testing::Message::Message(&local_510);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  local_538 = 0;
  local_530 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_a8,&local_538);
  local_53c = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_528,"subgraph.local_global(0)","4",&local_530,&local_53c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar2) {
    testing::Message::Message(&local_548);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar2 = testing::internal::DeathTest::Create
                      ("subgraph.update_levels(Adjacency_Graph<false>(), 1, i_global_local)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                       ,0x221,&local_558);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      if (local_558 == (pointer)0x0) goto LAB_00130337;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_558);
      iVar3 = (*local_558->_vptr_DeathTest[2])();
      if (iVar3 == 0) {
        iVar3 = (*local_558->_vptr_DeathTest[3])();
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        uVar4 = (*local_558->_vptr_DeathTest[4])(local_558,(ulong)bVar2);
        if ((uVar4 & 1) != 0) goto LAB_00130245;
        local_5f4 = 5;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_580,local_558);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            local_5b8.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_5b8.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_5b8.vertex_adjacent_list.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_5b8.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_5b8.vertex_adjacent_list.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_5b8.vertex_adjacent_list.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            Disa::Adjacency_Graph<false>::Adjacency_Graph(&local_5b8);
            std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
                      ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       &gtest_exception,
                       (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       local_100);
            Disa::Adjacency_Subgraph::update_levels
                      ((Adjacency_Subgraph *)local_a8,&local_5b8,1,
                       (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       &gtest_exception);
            std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
            ~shared_ptr((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                        &gtest_exception);
            Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_5b8);
          }
          (*local_558->_vptr_DeathTest[5])(local_558,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_580);
        }
LAB_00130245:
        local_5f4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_5f4 == 0) goto LAB_00130337;
    }
  }
  testing::Message::Message(&local_600);
  pcVar5 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)((long)&gtest_msg.value.field_2 + 8),kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
             ,0x221,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)((long)&gtest_msg.value.field_2 + 8),&local_600);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)((long)&gtest_msg.value.field_2 + 8));
  testing::Message::~Message(&local_600);
LAB_00130337:
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_628 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_628);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_628);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_6c0 = 4;
      local_6b8 = &local_6c0;
      local_6b0 = 1;
      std::allocator<unsigned_long>::allocator(&local_6c1);
      __l._M_len = local_6b0;
      __l._M_array = local_6b8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_6a8,__l,&local_6c1);
      Disa::Adjacency_Subgraph::Adjacency_Subgraph
                (&local_690,
                 (Adjacency_Graph<false> *)
                 &subgraph.level_set_value.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_6a8,2);
      std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
                ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&e,
                 (nullptr_t)0x0);
      Disa::Adjacency_Subgraph::update_levels
                (&local_690,
                 (Adjacency_Graph<false> *)
                 &subgraph.level_set_value.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,1,
                 (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&e);
      std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
                ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&e);
      Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_690);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_6a8);
      std::allocator<unsigned_long>::~allocator(&local_6c1);
    }
  }
  else {
    testing::Message::Message(local_708);
    std::operator+(&local_730,
                   "Expected: Adjacency_Subgraph(graph, {4}, 2).update_levels(graph, 1); doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_628
                  );
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_730);
    testing::internal::AssertHelper::AssertHelper
              (&local_710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x222,pcVar5);
    testing::internal::AssertHelper::operator=(&local_710,local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_710);
    std::__cxx11::string::~string((string *)&local_730);
    testing::Message::~Message(local_708);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_628);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_100);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_a8);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph
            ((Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, update_levels_remove) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);
  Adjacency_Subgraph subgraph(graph, {4}, 2);
  std::shared_ptr<std::vector<std::size_t>> i_global_local = std::make_shared<std::vector<std::size_t>>();

  subgraph.update_levels(graph, 1, i_global_local);
  EXPECT_FALSE(i_global_local == nullptr);
  EXPECT_FALSE(i_global_local->empty());
  EXPECT_TRUE(subgraph.is_parent(graph));

  // Check graph details
  EXPECT_EQ(subgraph.size_vertex(), 5);
  EXPECT_EQ(subgraph.size_edge(), 4);
  EXPECT_EQ(subgraph.vertex_level(0), 0);
  EXPECT_EQ(subgraph.vertex_level(1), 1);
  EXPECT_EQ(subgraph.vertex_level(2), 1);
  EXPECT_EQ(subgraph.vertex_level(3), 1);
  EXPECT_EQ(subgraph.vertex_level(4), 1);
  FOR(i_vertex, subgraph.size_vertex())
  EXPECT_EQ((*i_global_local)[subgraph.local_global(i_vertex)], i_vertex);
  EXPECT_EQ((*i_global_local)[0], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[2], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[6], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[8], std::numeric_limits<std::size_t>::max());

  subgraph.update_levels(graph, 0);
  EXPECT_TRUE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 1);
  EXPECT_EQ(subgraph.size_edge(), 0);

  // Check graph details
  EXPECT_EQ(subgraph.vertex_level(0), 0);
  EXPECT_EQ(subgraph.local_global(0), 4);

  EXPECT_DEATH(subgraph.update_levels(Adjacency_Graph<false>(), 1, i_global_local), "./*");
  EXPECT_NO_THROW(Adjacency_Subgraph(graph, {4}, 2).update_levels(graph, 1););  // ensure default does not throw.
}